

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

void __thiscall gnuplotio::FileHandleWrapper::fh_close(FileHandleWrapper *this)

{
  int iVar1;
  
  if (this->should_use_pclose == true) {
    iVar1 = pclose((FILE *)this->wrapped_fh);
    if (iVar1 != 0) {
      perror("pclose");
      return;
    }
  }
  else {
    iVar1 = fclose((FILE *)this->wrapped_fh);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"fclose returned error",0x15);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      return;
    }
  }
  return;
}

Assistant:

void fh_close() {
        if(should_use_pclose) {
            if(GNUPLOT_PCLOSE(wrapped_fh)) {
                perror("pclose");
                //char msg[1000];
                //strerror_s(msg, sizeof(msg), errno);
                //std::cerr << "pclose returned error: " << msg << std::endl;
            }
        } else {
            if(fclose(wrapped_fh)) {
                std::cerr << "fclose returned error" << std::endl;
            }
        }
    }